

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

SetInfluences * __thiscall
wasm::LocalGraphFlower::getSetInfluencesGivenObstacle
          (SetInfluences *__return_storage_ptr__,LocalGraphFlower *this,LocalSet *set,
          SetInfluences *gets,Expression *obstacle)

{
  LocalSet *pLVar1;
  pointer ppFVar2;
  mapped_type *pmVar3;
  FlowBlock *pFVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  pointer ppFVar7;
  bool bVar8;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar9;
  pair<std::__detail::_Node_iterator<wasm::LocalGet_*,_true,_false>,_bool> pVar10;
  undefined1 auStack_128 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
  work;
  key_type local_58;
  LocalGet *get;
  uint local_44;
  _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_40;
  __hashtable *__h;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var5 = (gets->_M_h)._M_before_begin._M_nxt;
  if (p_Var5 == (_Hash_node_base *)0x0) {
    return (SetInfluences *)
           (_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)__return_storage_ptr__;
  }
  get = (LocalGet *)&this->getLocations;
  local_40 = (_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__;
LAB_0071c330:
  local_58 = (key_type)p_Var5[1]._M_nxt;
  pmVar3 = std::__detail::
           _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)get,&local_58);
  if (pmVar3->first != (FlowBlock *)0x0) {
    local_44 = pmVar3->second;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    auStack_128 = (undefined1  [8])0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    __h = (__hashtable *)pmVar3->first;
    std::
    _Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ::_M_initialize_map((_Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                         *)auStack_128,0);
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    data.c.
    super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)
         &work.
          super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
          count._M_h._M_rehash_policy._M_next_resize;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_buckets = (__buckets_ptr)0x1;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_bucket_count = 0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_element_count._0_4_ = 0x3f800000;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_rehash_policy._4_4_ = 0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_rehash_policy._M_next_resize = 0;
    work.super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>.
    count._M_h._M_single_bucket =
         (__node_base_ptr)&work.processed._M_h._M_rehash_policy._M_next_resize;
    work.processed._M_h._M_buckets = (__buckets_ptr)0x1;
    work.processed._M_h._M_bucket_count = 0;
    work.processed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    work.processed._M_h._M_element_count._0_4_ = 0x3f800000;
    work.processed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    work.processed._M_h._M_rehash_policy._4_4_ = 0;
    work.processed._M_h._M_rehash_policy._M_next_resize = 0;
    pVar9.second = local_44;
    pVar9.first = (FlowBlock *)__h;
    pVar9._12_4_ = 0;
    UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
    push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
          *)auStack_128,pVar9);
    __h = (__hashtable *)((ulong)__h & 0xffffffff00000000);
LAB_0071c3f9:
    do {
      if ((((long)((long)work.
                         super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                         .data.c.
                         super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_first -
                  work.
                  super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  .data.c.
                  super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size) >> 4) +
           ((long)work.
                  super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  .data.c.
                  super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node -
            (long)work.
                  super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  .data.c.
                  super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 4) +
           ((((ulong)((long)work.
                            super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                            .data.c.
                            super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last -
                     (long)work.
                           super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                           .data.c.
                           super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
           (ulong)(work.
                   super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                   .data.c.
                   super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x20
           == 0) || (((ulong)__h & 1) != 0)) goto LAB_0071c4e5;
      pVar9 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
              ::pop((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                     *)auStack_128);
      pFVar4 = pVar9.first;
      uVar6 = (ulong)pVar9.second;
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        pLVar1 = (LocalSet *)
                 (pFVar4->actions).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar6];
        if ((pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
            LocalSetId) {
          if (pLVar1 == set) {
            work.processed._M_h._M_single_bucket = (__node_base_ptr)local_40;
            pVar10 = std::
                     _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     ::
                     _M_insert<wasm::LocalGet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalGet*,false>>>>
                               (local_40,&local_58,&work.processed._M_h._M_single_bucket);
            __h = (__hashtable *)
                  CONCAT44(__h._4_4_,
                           (int)CONCAT71(pVar10.first.
                                         super__Node_iterator_base<wasm::LocalGet_*,_false>._M_cur.
                                         _1_7_,1));
          }
          else if (pLVar1->index != set->index) goto LAB_0071c48b;
LAB_0071c4a9:
          bVar8 = false;
        }
        else {
          if (pLVar1 == (LocalSet *)obstacle) goto LAB_0071c4a9;
LAB_0071c48b:
          bVar8 = true;
        }
        if (!bVar8) goto LAB_0071c3f9;
      }
      ppFVar2 = (pFVar4->in).
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar7 = (pFVar4->in).
                     super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar2;
          ppFVar7 = ppFVar7 + 1) {
        pFVar4 = *ppFVar7;
        item._8_8_ = (ulong)((long)(pFVar4->actions).
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pFVar4->actions).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3;
        item.first = pFVar4;
        UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
        ::push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                *)auStack_128,item);
      }
    } while( true );
  }
  goto LAB_0071c50f;
LAB_0071c4e5:
  std::
  _Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&work.
                    super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                    .count._M_h._M_single_bucket);
  std::
  _Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&work.
                           super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                           .data.c.
                           super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                           ._M_impl.super__Deque_impl_data + 0x48));
  std::
  _Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
  ::~_Deque_base((_Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                  *)auStack_128);
LAB_0071c50f:
  p_Var5 = p_Var5->_M_nxt;
  if (p_Var5 == (_Hash_node_base *)0x0) {
    return (SetInfluences *)local_40;
  }
  goto LAB_0071c330;
}

Assistant:

LocalGraphBase::SetInfluences
  getSetInfluencesGivenObstacle(LocalSet* set,
                                const LocalGraphBase::SetInfluences& gets,
                                Expression* obstacle) {
    LocalGraphBase::SetInfluences ret;
    // Normally flowing backwards is faster, as we start from actual gets (and
    // so we avoid flowing past all the gets to large swaths of the program that
    // we don't care about; and in reverse, we might go all the way to the
    // entry in a wasteful manner, but most gets have an actual set, and do not
    // read the default value). The situation here is a bit different, though,
    // in that we might expect that going forward from the set would quickly
    // reach the obstacle and stop. Still, a single branch away would cause us
    // to scan lots of blocks potentially, and might not be that rare in
    // general, so go backwards. (Many uninteresting branches away, that reach
    // no relevant gets, are common when exceptions are enabled, as every call
    // gets a branch.)
    for (auto* get : gets) {
      auto [block, index] = getLocations[get];
      if (!block) {
        // We did not find location info for this get, which means it is
        // unreachable.
        continue;
      }

      // Use a work queue of block locations to scan backwards from.
      // Specifically we must scan the first index above it (i.e., the original
      // location has a local.get there, so we start one before it).
      UniqueNonrepeatingDeferredQueue<BlockLocation> work;
      work.push(BlockLocation{block, index});
      auto foundSet = false;
      // Flow while there is stuff to flow, and while we haven't found the set
      // (once we find it, we add the get and can move on to the next get).
      while (!work.empty() && !foundSet) {
        auto [block, index] = work.pop();

        // Scan backwards through this block.
        while (1) {
          // If we finished scanning this block (we reached the top), flow to
          // predecessors.
          if (index == 0) {
            for (auto* pred : block->in) {
              // We will scan pred from its very end.
              work.push(BlockLocation{pred, Index(pred->actions.size())});
            }
            break;
          }

          // Continue onwards.
          index--;
          auto* action = block->actions[index];
          if (auto* otherSet = action->dynCast<LocalSet>()) {
            if (otherSet == set) {
              // We arrived at the set: add this get and stop flowing it.
              ret.insert(get);
              foundSet = true;
              break;
            }
            if (otherSet->index == set->index) {
              // This is another set of the same index, which halts the flow.
              break;
            }
          } else if (action == obstacle) {
            // We ran into the obstacle. Halt this flow.
            break;
          }
          // TODO: If the action is one of the gets we are scanning, then
          // either we have processed it already, or will do so later, and we
          // can halt. As an optimization, we could check if we've processed
          // it already and act accordingly.
        }
      }
    }

    return ret;
  }